

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O0

int do_backtrack(saucy *s)

{
  int iVar1;
  int iVar2;
  int local_20;
  int cb;
  int cf;
  int i;
  saucy *s_local;
  
  rewind_coloring(s,&s->right,s->lev);
  s->nsplits = s->splitlev[s->lev];
  cb = s->ndiffs;
  while (cb = cb + -1, s->difflev[s->lev] <= cb) {
    s->diffmark[s->diffs[cb]] = '\0';
  }
  s->ndiffs = s->difflev[s->lev];
  s->nundiffs = s->undifflev[s->lev];
  iVar1 = s->start[s->lev];
  iVar2 = (s->right).clen[iVar1];
  if (s->lev < s->anc) {
    s->anc = s->lev;
    s->indmin = (s->left).lab[iVar1 + iVar2];
    s->match = 1;
    note_anctar_reps(s);
  }
  if (s->lev == s->anc) {
    local_20 = backtrack_leftmost(s);
  }
  else {
    local_20 = backtrack_other(s);
  }
  return local_20;
}

Assistant:

static int
do_backtrack(struct saucy *s)
{
    int i, cf, cb;

    /* Undo the splits up to this level */
    rewind_coloring(s, &s->right, s->lev);
    s->nsplits = s->splitlev[s->lev];

    /* Rewind diff information */
    for (i = s->ndiffs - 1; i >= s->difflev[s->lev]; --i) {
        s->diffmark[s->diffs[i]] = 0;
    }
    s->ndiffs = s->difflev[s->lev];
    s->nundiffs = s->undifflev[s->lev];

    /* Point to the target cell */
    cf = s->start[s->lev];
    cb = cf + s->right.clen[cf];

    /* Update ancestor with zeta if we've rewound more */
    if (s->anc > s->lev) {
        s->anc = s->lev;
        s->indmin = s->left.lab[cb];
        s->match = 1;
        note_anctar_reps(s);
    }

    /* Perform backtracking appropriate to our location */
    return s->lev == s->anc
        ? backtrack_leftmost(s)
        : backtrack_other(s);
}